

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

int __thiscall Config::GetInt(Config *this,string *key,int val)

{
  size_type sVar1;
  char *__nptr;
  int val_local;
  string *key_local;
  Config *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->config_,key);
  this_local._4_4_ = val;
  if (sVar1 != 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&this->config_,key);
    __nptr = (char *)std::__cxx11::string::c_str();
    this_local._4_4_ = atoi(__nptr);
  }
  return this_local._4_4_;
}

Assistant:

int Config::GetInt(string key, int val)
{
    if (config_.count(key) == 0)
        return val;
    return atoi(config_[key].c_str());
}